

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateArgumentUpvalueClose(ExpressionContext *ctx,SynBase *source,FunctionData *onwerFunction)

{
  Lexeme *allocator;
  TypeBase *type;
  ExprSequence *pEVar1;
  FunctionData *source_00;
  ExpressionContext *this;
  CloseUpvaluesData *this_00;
  ArrayView<ExprBase_*> arr;
  undefined1 local_40 [12];
  ExpressionContext *local_30;
  ExprSequence *holder;
  FunctionData *onwerFunction_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  if (onwerFunction == (FunctionData *)0x0) {
    ctx_local = (ExpressionContext *)0x0;
  }
  else {
    holder = (ExprSequence *)onwerFunction;
    onwerFunction_local = (FunctionData *)source;
    source_local = (SynBase *)ctx;
    this = (ExpressionContext *)ExpressionContext::get<ExprSequence>(ctx);
    source_00 = onwerFunction_local;
    allocator = source_local[0x229].begin;
    type = *(TypeBase **)&source_local[0x226].listed;
    ArrayView<ExprBase_*>::ArrayView((ArrayView<ExprBase_*> *)local_40);
    arr._12_4_ = 0;
    arr.data = (ExprBase **)local_40._0_8_;
    arr.count = local_40._8_4_;
    ExprSequence::ExprSequence
              ((ExprSequence *)this,(Allocator *)allocator,(SynBase *)source_00,type,arr);
    pEVar1 = holder + 7;
    local_30 = this;
    this_00 = ExpressionContext::get<CloseUpvaluesData>((ExpressionContext *)source_local);
    CloseUpvaluesData::CloseUpvaluesData
              (this_00,(ExprSequence *)local_30,CLOSE_UPVALUES_ARGUMENT,
               (SynBase *)onwerFunction_local,(ScopeData *)0x0,0);
    IntrusiveList<CloseUpvaluesData>::push_back
              ((IntrusiveList<CloseUpvaluesData> *)(pEVar1->expressions).little,this_00);
    ctx_local = local_30;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* CreateArgumentUpvalueClose(ExpressionContext &ctx, SynBase *source, FunctionData *onwerFunction)
{
	if(!onwerFunction)
		return NULL;

	ExprSequence *holder = new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, source, ctx.typeVoid, ArrayView<ExprBase*>());

	onwerFunction->closeUpvalues.push_back(new (ctx.get<CloseUpvaluesData>()) CloseUpvaluesData(holder, CLOSE_UPVALUES_ARGUMENT, source, NULL, 0));

	return holder;
}